

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

Variable __thiscall LiteScript::_Type_ARRAY::Convert(_Type_ARRAY *this,Variable *object,Type *type)

{
  bool bVar1;
  String *this_00;
  Array *obj;
  Array *this_01;
  Object *pOVar2;
  Type *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  Variable VVar4;
  string local_70 [32];
  String local_50;
  undefined1 local_29;
  Type *local_28;
  Type *type_local;
  Variable *object_local;
  _Type_ARRAY *this_local;
  Variable *result;
  uint *puVar3;
  
  local_28 = in_RCX;
  type_local = type;
  object_local = object;
  this_local = this;
  bVar1 = Type::operator==(in_RCX,(Type *)_type_string);
  if (bVar1) {
    local_29 = 0;
    pOVar2 = Variable::operator->((Variable *)type_local);
    Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    (*(code *)object->obj[7].data)(local_70,object,type_local);
    String::String(&local_50,local_70);
    pOVar2 = Variable::operator->((Variable *)this);
    this_00 = Object::GetData<LiteScript::String>(pOVar2);
    String::operator=(this_00,&local_50);
    String::~String(&local_50);
    std::__cxx11::string::~string((string *)local_70);
    puVar3 = extraout_RDX;
  }
  else {
    bVar1 = Type::operator==(local_28,(Type *)_type_array);
    if (bVar1) {
      pOVar2 = Variable::operator->((Variable *)type_local);
      Memory::Create((Memory *)this,(Type *)pOVar2->memory);
      pOVar2 = Variable::operator->((Variable *)type_local);
      obj = Object::GetData<LiteScript::Array>(pOVar2);
      pOVar2 = Variable::operator->((Variable *)this);
      this_01 = Object::GetData<LiteScript::Array>(pOVar2);
      Array::operator=(this_01,obj);
      puVar3 = extraout_RDX_00;
    }
    else {
      pOVar2 = Variable::operator->((Variable *)type_local);
      VVar4 = Memory::Create((Memory *)this,(Type *)pOVar2->memory);
      puVar3 = VVar4.nb_ref;
    }
  }
  VVar4.nb_ref = puVar3;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_ARRAY::Convert(const Variable &object, const Type &type) const {
    if (type == Type::STRING) {
        Variable result = object->memory.Create(Type::STRING);
        result->GetData<String>() = String(this->ToString(object));
        return result;
    }
    else if (type == Type::ARRAY) {
        Variable result = object->memory.Create(Type::ARRAY);
        result->GetData<Array>() = object->GetData<Array>();
        return result;
    }
    else {
        return object->memory.Create(Type::NIL);
    }
}